

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void do_forage(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  int iVar2;
  int iVar3;
  CClass *this;
  OBJ_INDEX_DATA *pOVar4;
  OBJ_DATA *pOVar5;
  char *txt;
  long lVar6;
  
  iVar2 = get_skill(ch,(int)gsn_forage);
  if (iVar2 != 0) {
    sVar1 = ch->level;
    lVar6 = (long)gsn_forage;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar3 = CClass::GetIndex(this);
    if (*(short *)(lVar6 * 0x60 + 0x44e788 + (long)iVar3 * 2) <= sVar1) {
      if (ch->in_room->sector_type == 3) {
        iVar3 = 0x5a;
        if (iVar2 < 0x5a) {
          iVar3 = iVar2;
        }
        iVar2 = number_percent();
        if (iVar3 < iVar2) {
          act("$n messes about in the undergrowth but comes up looking perplexed.",ch,(void *)0x0,
              (void *)0x0,0);
          send_to_char("You search around but find nothing you can recognise as edible.\n\r",ch);
          check_improve(ch,(int)gsn_forage,false,2);
          WAIT_STATE(ch,0xc);
          return;
        }
        act("$n messes about in the nearby bushes and comes out with some berries.",ch,(void *)0x0,
            (void *)0x0,0);
        send_to_char("You search around and find some edible berries in the bushes.\n\r",ch);
        check_improve(ch,(int)gsn_forage,true,2);
        iVar2 = number_range(1,3);
        pOVar4 = get_obj_index(0);
        pOVar5 = create_object(pOVar4,1);
        if (pOVar5 != (OBJ_DATA *)0x0) {
          obj_to_char(pOVar5,ch);
          if (1 < iVar2) {
            pOVar4 = get_obj_index(0);
            pOVar5 = create_object(pOVar4,1);
            obj_to_char(pOVar5,ch);
            return;
          }
        }
        return;
      }
      txt = "You aren\'t in a suitable forest region where you can apply your plant lore.\n\r";
      goto LAB_00298f4b;
    }
  }
  txt = "You aren\'t able to decide on which plants are edible.\n\r";
LAB_00298f4b:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_forage(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *berry_1;
	OBJ_DATA *berry_2;
	int chance, found;

	chance = get_skill(ch, gsn_forage);

	if (chance == 0
		|| ch->level < skill_table[gsn_forage].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You aren't able to decide on which plants are edible.\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type != SECT_FOREST)
	{
		send_to_char("You aren't in a suitable forest region where you can apply your plant lore.\n\r", ch);
		return;
	}

	if (chance > 90)
		chance = 90;

	if (number_percent() > chance)
	{
		act("$n messes about in the undergrowth but comes up looking perplexed.", ch, 0, 0, TO_ROOM);
		send_to_char("You search around but find nothing you can recognise as edible.\n\r", ch);
		check_improve(ch, gsn_forage, false, 2);
		WAIT_STATE(ch, 12);
		return;
	}

	act("$n messes about in the nearby bushes and comes out with some berries.", ch, 0, 0, TO_ROOM);
	send_to_char("You search around and find some edible berries in the bushes.\n\r", ch);
	check_improve(ch, gsn_forage, true, 2);

	found = number_range(1, 3);

	berry_1 = create_object(get_obj_index(OBJ_VNUM_BERRY), 1);
	if (berry_1 == nullptr)
		return;

	obj_to_char(berry_1, ch);

	if (found >= 2)
	{
		berry_2 = create_object(get_obj_index(OBJ_VNUM_BERRY), 1);
		obj_to_char(berry_2, ch);
	}
	/*
	if (found >= 3)
	{
		berry_3 = create_object(get_obj_index(OBJ_VNUM_BERRY),1);
		obj_to_char(berry_3,ch);
	}

	if (found >= 4)
	{
		berry_4 = create_object(get_obj_index(OBJ_VNUM_BERRY),1);
		obj_to_char(berry_4,ch);
	}
	*/
}